

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::WriteChaptersCuePayload(FILE *f,Display *display)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  int local_80;
  undefined1 local_68 [4];
  int e;
  string line;
  undefined1 local_40 [4];
  int count;
  ChapterAtomParser parser;
  Display *display_local;
  FILE *f_local;
  
  parser.str_end_ = (char *)display;
  ChapterAtomParser::ChapterAtomParser((ChapterAtomParser *)local_40,display);
  line.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_68);
  do {
    iVar1 = libwebvtt::LineReader::GetLine((LineReader *)local_40,(string *)local_68);
    if (iVar1 < 0) {
      f_local._7_1_ = 0;
      local_80 = 1;
LAB_0011a745:
      std::__cxx11::string::~string((string *)local_68);
      if (local_80 == 2) {
        if ((int)line.field_2._12_4_ < 1) {
          f_local._7_1_ = 0;
        }
        else {
          f_local._7_1_ = 1;
        }
      }
      ChapterAtomParser::~ChapterAtomParser((ChapterAtomParser *)local_40);
      return (bool)(f_local._7_1_ & 1);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      local_80 = 2;
      goto LAB_0011a745;
    }
    uVar3 = std::__cxx11::string::c_str();
    iVar1 = fprintf((FILE *)f,"%s\n",uVar3);
    if (iVar1 < 0) {
      f_local._7_1_ = 0;
      local_80 = 1;
      goto LAB_0011a745;
    }
    line.field_2._12_4_ = line.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

bool vttdemux::WriteChaptersCuePayload(
    FILE* f, const mkvparser::Chapters::Display* display) {
  // Bind a Chapter parser object to the display, which allows us to
  // extract each line of text from the title-part of the display.
  ChapterAtomParser parser(display);

  int count = 0;  // count of lines of payload text written to output file
  for (string line;;) {
    const int e = parser.GetLine(&line);

    if (e < 0)  // error (only -- we allow EOS here)
      return false;

    if (line.empty())  // TODO(matthewjheaney): retain this check?
      break;

    if (fprintf(f, "%s\n", line.c_str()) < 0)
      return false;

    ++count;
  }

  if (count <= 0)  // WebVTT cue requires non-empty payload
    return false;

  return true;
}